

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

cmStateSnapshot * __thiscall cmState::Reset(cmStateSnapshot *__return_storage_ptr__,cmState *this)

{
  cmLinkedTree<cmDefinitions> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  pointer pcVar6;
  pointer puVar7;
  pointer pPVar8;
  cmLinkedTree<cmStateDetail::PolicyStackEntry> *pcVar9;
  StackIter end;
  StackIter begin;
  StackIter end_00;
  StackIter begin_00;
  cmStateSnapshot *pcVar10;
  PointerType pBVar11;
  PointerType pSVar12;
  char *pcVar13;
  PointerType pcVar14;
  mapped_type *pmVar15;
  pointer pcVar16;
  iterator iVar17;
  iterator it;
  PositionType pos;
  string binDir;
  undefined1 local_b0 [32];
  iterator local_90;
  allocator local_79;
  string local_78;
  string local_58;
  cmStateSnapshot *local_38;
  
  local_38 = __return_storage_ptr__;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
           *)&this->GlobalProperties);
  std::
  _Rb_tree<cmProperty::ScopeType,_std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>,_std::_Select1st<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
  ::clear((_Rb_tree<cmProperty::ScopeType,_std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>,_std::_Select1st<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
           *)this);
  local_90 = cmLinkedTree<cmStateDetail::SnapshotDataType>::Truncate(&this->SnapshotData);
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Truncate(&this->ExecutionListFiles);
  local_b0._0_16_ =
       (undefined1  [16])
       cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::Truncate
                 (&this->BuildsystemDirectory);
  pBVar11 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&pBVar11->IncludeDirectories,
                    (pBVar11->IncludeDirectories).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pBVar11 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_b0);
  pcVar4 = (pBVar11->IncludeDirectoryBacktraces).
           super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar5 = (pBVar11->IncludeDirectoryBacktraces).
           super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar16 = pcVar4;
  if (pcVar5 != pcVar4) {
    do {
      cmListFileBacktrace::~cmListFileBacktrace(pcVar16);
      pcVar16 = pcVar16 + 1;
    } while (pcVar16 != pcVar5);
    (pBVar11->IncludeDirectoryBacktraces).
    super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar4;
  }
  pBVar11 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&pBVar11->CompileDefinitions,
                    (pBVar11->CompileDefinitions).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pBVar11 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_b0);
  pcVar4 = (pBVar11->CompileDefinitionsBacktraces).
           super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar5 = (pBVar11->CompileDefinitionsBacktraces).
           super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar16 = pcVar4;
  if (pcVar5 != pcVar4) {
    do {
      cmListFileBacktrace::~cmListFileBacktrace(pcVar16);
      pcVar16 = pcVar16 + 1;
    } while (pcVar16 != pcVar5);
    (pBVar11->CompileDefinitionsBacktraces).
    super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar4;
  }
  pBVar11 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&pBVar11->CompileOptions,
                    (pBVar11->CompileOptions).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pBVar11 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_b0);
  pcVar4 = (pBVar11->CompileOptionsBacktraces).
           super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar5 = (pBVar11->CompileOptionsBacktraces).
           super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar16 = pcVar4;
  if (pcVar5 != pcVar4) {
    do {
      cmListFileBacktrace::~cmListFileBacktrace(pcVar16);
      pcVar16 = pcVar16 + 1;
    } while (pcVar16 != pcVar5);
    (pBVar11->CompileOptionsBacktraces).
    super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar4;
  }
  pBVar11 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_b0);
  (pBVar11->DirectoryEnd).Tree = local_90.Tree;
  (pBVar11->DirectoryEnd).Position = local_90.Position;
  pBVar11 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&pBVar11->NormalTargetNames,
                    (pBVar11->NormalTargetNames).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pBVar11 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
           *)&pBVar11->Properties);
  pBVar11 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_b0);
  pcVar6 = (pBVar11->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pBVar11->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
      _M_impl.super__Vector_impl_data._M_finish != pcVar6) {
    (pBVar11->Children).super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
    _M_impl.super__Vector_impl_data._M_finish = pcVar6;
  }
  puVar7 = (this->PolicyStack).UpPositions.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->PolicyStack).UpPositions.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar7) {
    (this->PolicyStack).UpPositions.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar7;
  }
  pcVar9 = &this->PolicyStack;
  pPVar8 = (this->PolicyStack).Data.
           super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->PolicyStack).Data.
      super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish != pPVar8) {
    (this->PolicyStack).Data.
    super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar8;
  }
  pSVar12 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_90);
  (pSVar12->Policies).Tree = pcVar9;
  (pSVar12->Policies).Position = 0;
  pSVar12 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_90);
  (pSVar12->PolicyRoot).Tree = pcVar9;
  (pSVar12->PolicyRoot).Position = 0;
  pSVar12 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_90);
  (pSVar12->PolicyScope).Tree = pcVar9;
  (pSVar12->PolicyScope).Position = 0;
  pSVar12 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_90);
  pcVar9 = (pSVar12->Policies).Tree;
  if ((pcVar9 != (cmLinkedTree<cmStateDetail::PolicyStackEntry> *)0x0) &&
     ((pSVar12->Policies).Position <=
      (ulong)(((long)(pcVar9->Data).
                     super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pcVar9->Data).
                     super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333))) {
    pSVar12 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_90);
    pcVar9 = (pSVar12->PolicyRoot).Tree;
    if ((pcVar9 != (cmLinkedTree<cmStateDetail::PolicyStackEntry> *)0x0) &&
       ((pSVar12->PolicyRoot).Position <=
        (ulong)(((long)(pcVar9->Data).
                       super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pcVar9->Data).
                       super__Vector_base<cmStateDetail::PolicyStackEntry,_std::allocator<cmStateDetail::PolicyStackEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333))) {
      paVar1 = &local_78.field_2;
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"CMAKE_SOURCE_DIR","");
      pSVar12 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_90);
      begin.Tree = (pSVar12->Vars).Tree;
      begin.Position = (pSVar12->Vars).Position;
      pSVar12 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_90);
      end.Tree = (pSVar12->Root).Tree;
      end.Position = (pSVar12->Root).Position;
      pcVar13 = cmDefinitions::Get(&local_78,begin,end);
      std::__cxx11::string::string((string *)local_b0,pcVar13,(allocator *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      paVar2 = &local_58.field_2;
      local_58._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CMAKE_BINARY_DIR","");
      pSVar12 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_90);
      begin_00.Tree = (pSVar12->Vars).Tree;
      begin_00.Position = (pSVar12->Vars).Position;
      pSVar12 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_90);
      end_00.Tree = (pSVar12->Root).Tree;
      end_00.Position = (pSVar12->Root).Position;
      pcVar13 = cmDefinitions::Get(&local_58,begin_00,end_00);
      std::__cxx11::string::string((string *)&local_78,pcVar13,&local_79);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      this_00 = &this->VarTree;
      cmLinkedTree<cmDefinitions>::Clear(this_00);
      iVar17.Position = 0;
      iVar17.Tree = this_00;
      iVar17 = cmLinkedTree<cmDefinitions>::Push(this_00,iVar17);
      pSVar12 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_90);
      pSVar12->Vars = iVar17;
      pSVar12 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_90);
      (pSVar12->Parent).Tree = this_00;
      (pSVar12->Parent).Position = 0;
      pSVar12 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_90);
      (pSVar12->Root).Tree = this_00;
      (pSVar12->Root).Position = 0;
      pSVar12 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_90);
      pcVar14 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar12->Vars);
      local_58._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CMAKE_SOURCE_DIR","");
      cmDefinitions::Set(pcVar14,&local_58,(char *)local_b0._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      pSVar12 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_90);
      pcVar14 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar12->Vars);
      local_58._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CMAKE_BINARY_DIR","");
      cmDefinitions::Set(pcVar14,&local_58,local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)(local_b0 + 0x10);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_b0._0_8_ != pcVar3) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      local_b0._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"RULE_LAUNCH_COMPILE","");
      local_78._M_dataplus._M_p._0_4_ = 2;
      pmVar15 = std::
                map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                ::operator[](&this->PropertyDefinitions,(key_type *)&local_78);
      cmPropertyDefinitionMap::DefineProperty
                (pmVar15,(string *)local_b0,(ScopeType)local_78._M_dataplus._M_p,"","",true);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_b0._0_8_ != pcVar3) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      local_b0._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"RULE_LAUNCH_LINK","");
      local_78._M_dataplus._M_p._0_4_ = 2;
      pmVar15 = std::
                map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                ::operator[](&this->PropertyDefinitions,(key_type *)&local_78);
      cmPropertyDefinitionMap::DefineProperty
                (pmVar15,(string *)local_b0,(ScopeType)local_78._M_dataplus._M_p,"","",true);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_b0._0_8_ != pcVar3) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      local_b0._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"RULE_LAUNCH_CUSTOM","");
      local_78._M_dataplus._M_p._0_4_ = 2;
      pmVar15 = std::
                map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                ::operator[](&this->PropertyDefinitions,(key_type *)&local_78);
      cmPropertyDefinitionMap::DefineProperty
                (pmVar15,(string *)local_b0,(ScopeType)local_78._M_dataplus._M_p,"","",true);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_b0._0_8_ != pcVar3) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      local_b0._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"RULE_LAUNCH_COMPILE","");
      local_78._M_dataplus._M_p = local_78._M_dataplus._M_p & 0xffffffff00000000;
      pmVar15 = std::
                map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                ::operator[](&this->PropertyDefinitions,(key_type *)&local_78);
      cmPropertyDefinitionMap::DefineProperty
                (pmVar15,(string *)local_b0,(ScopeType)local_78._M_dataplus._M_p,"","",true);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_b0._0_8_ != pcVar3) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      local_b0._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"RULE_LAUNCH_LINK","");
      local_78._M_dataplus._M_p = local_78._M_dataplus._M_p & 0xffffffff00000000;
      pmVar15 = std::
                map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                ::operator[](&this->PropertyDefinitions,(key_type *)&local_78);
      cmPropertyDefinitionMap::DefineProperty
                (pmVar15,(string *)local_b0,(ScopeType)local_78._M_dataplus._M_p,"","",true);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_b0._0_8_ != pcVar3) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      local_b0._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"RULE_LAUNCH_CUSTOM","");
      local_78._M_dataplus._M_p = local_78._M_dataplus._M_p & 0xffffffff00000000;
      pmVar15 = std::
                map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                ::operator[](&this->PropertyDefinitions,(key_type *)&local_78);
      cmPropertyDefinitionMap::DefineProperty
                (pmVar15,(string *)local_b0,(ScopeType)local_78._M_dataplus._M_p,"","",true);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_b0._0_8_ != pcVar3) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      pcVar10 = local_38;
      cmStateSnapshot::cmStateSnapshot(local_38,this,local_90);
      return pcVar10;
    }
    __assert_fail("pos->PolicyRoot.IsValid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmState.cxx"
                  ,0x102,"cmStateSnapshot cmState::Reset()");
  }
  __assert_fail("pos->Policies.IsValid()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmState.cxx"
                ,0x101,"cmStateSnapshot cmState::Reset()");
}

Assistant:

cmStateSnapshot cmState::Reset()
{
  this->GlobalProperties.clear();
  this->PropertyDefinitions.clear();

  cmStateDetail::PositionType pos = this->SnapshotData.Truncate();
  this->ExecutionListFiles.Truncate();

  {
    cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator it =
      this->BuildsystemDirectory.Truncate();
    it->IncludeDirectories.clear();
    it->IncludeDirectoryBacktraces.clear();
    it->CompileDefinitions.clear();
    it->CompileDefinitionsBacktraces.clear();
    it->CompileOptions.clear();
    it->CompileOptionsBacktraces.clear();
    it->DirectoryEnd = pos;
    it->NormalTargetNames.clear();
    it->Properties.clear();
    it->Children.clear();
  }

  this->PolicyStack.Clear();
  pos->Policies = this->PolicyStack.Root();
  pos->PolicyRoot = this->PolicyStack.Root();
  pos->PolicyScope = this->PolicyStack.Root();
  assert(pos->Policies.IsValid());
  assert(pos->PolicyRoot.IsValid());

  {
    std::string srcDir =
      cmDefinitions::Get("CMAKE_SOURCE_DIR", pos->Vars, pos->Root);
    std::string binDir =
      cmDefinitions::Get("CMAKE_BINARY_DIR", pos->Vars, pos->Root);
    this->VarTree.Clear();
    pos->Vars = this->VarTree.Push(this->VarTree.Root());
    pos->Parent = this->VarTree.Root();
    pos->Root = this->VarTree.Root();

    pos->Vars->Set("CMAKE_SOURCE_DIR", srcDir.c_str());
    pos->Vars->Set("CMAKE_BINARY_DIR", binDir.c_str());
  }

  this->DefineProperty("RULE_LAUNCH_COMPILE", cmProperty::DIRECTORY, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_LINK", cmProperty::DIRECTORY, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_CUSTOM", cmProperty::DIRECTORY, "", "",
                       true);

  this->DefineProperty("RULE_LAUNCH_COMPILE", cmProperty::TARGET, "", "",
                       true);
  this->DefineProperty("RULE_LAUNCH_LINK", cmProperty::TARGET, "", "", true);
  this->DefineProperty("RULE_LAUNCH_CUSTOM", cmProperty::TARGET, "", "", true);

  return cmStateSnapshot(this, pos);
}